

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::OurReader::readCStyleComment(OurReader *this,bool *containsNewLineResult)

{
  char *pcVar1;
  char cVar2;
  
  *containsNewLineResult = false;
  do {
    while( true ) {
      pcVar1 = this->current_;
      if (this->end_ <= pcVar1 + 1) goto LAB_0012c359;
      if (pcVar1 == this->end_) {
        cVar2 = '\0';
      }
      else {
        this->current_ = pcVar1 + 1;
        cVar2 = *pcVar1;
      }
      if (cVar2 != '\n') break;
      *containsNewLineResult = true;
    }
  } while ((cVar2 != '*') || (*this->current_ != '/'));
LAB_0012c359:
  pcVar1 = this->current_;
  if (pcVar1 != this->end_) {
    this->current_ = pcVar1 + 1;
    return *pcVar1 == '/';
  }
  return false;
}

Assistant:

bool OurReader::readCStyleComment(bool* containsNewLineResult) {
  *containsNewLineResult = false;

  while ((current_ + 1) < end_) {
    Char c = getNextChar();
    if (c == '*' && *current_ == '/')
      break;
    if (c == '\n')
      *containsNewLineResult = true;
  }

  return getNextChar() == '/';
}